

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtReadHexNumber(word *pTruth,char *pString)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  
  uVar2 = 0;
  while ((0xf5 < (byte)(pString[uVar2] - 0x3aU) || (0xf9 < (byte)((pString[uVar2] & 0xdfU) + 0xb9)))
        ) {
    uVar2 = uVar2 + 1;
  }
  pbVar3 = (byte *)(pString + (int)uVar2);
  bVar4 = 0;
  uVar5 = 0;
  while( true ) {
    pbVar3 = pbVar3 + -1;
    if (uVar2 == uVar5) {
      return (int)uVar2;
    }
    bVar1 = *pbVar3;
    iVar6 = -0x30;
    if (((9 < (byte)(bVar1 - 0x30)) && (iVar6 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
       (iVar6 = -0x57, 5 < (byte)(bVar1 + 0x9f))) break;
    pTruth[uVar5 >> 4 & 0xfffffff] =
         pTruth[uVar5 >> 4 & 0xfffffff] | (ulong)(iVar6 + (uint)bVar1) << (bVar4 & 0x3c);
    uVar5 = uVar5 + 1;
    bVar4 = bVar4 + 4;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x4bf,"int Abc_TtReadHexDigit(char)");
}

Assistant:

static inline int Abc_TtReadHexNumber( word * pTruth, char * pString )
{
    // count the number of hex digits
    int k, Digit, nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    return nDigits;
}